

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall
cmMakefile::GetModulesFile
          (string *__return_storage_ptr__,cmMakefile *this,string *filename,bool *system,bool debug,
          string *debugBuffer)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmValue cVar3;
  string *psVar4;
  ostream *poVar5;
  PolicyID id;
  pointer pbVar6;
  string_view arg;
  string itempl;
  string moduleInCMakeRoot;
  string mods;
  string moduleInCMakeModulePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  string local_1c8;
  ostringstream e;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  moduleInCMakeRoot._M_dataplus._M_p = (pointer)&moduleInCMakeRoot.field_2;
  moduleInCMakeRoot._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  moduleInCMakeRoot.field_2._M_local_buf[0] = '\0';
  moduleInCMakeModulePath._M_dataplus._M_p = (pointer)&moduleInCMakeModulePath.field_2;
  moduleInCMakeModulePath._M_string_length = 0;
  moduleInCMakeModulePath.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_MODULE_PATH",(allocator<char> *)&mods);
  cVar3 = GetDefinition(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar3.Value != (string *)0x0) {
    arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar3.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&modulePath,arg,false);
    pbVar6 = modulePath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar6 == modulePath.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
      std::__cxx11::string::string((string *)&itempl,(string *)pbVar6);
      cmsys::SystemTools::ConvertToUnixSlashes(&itempl);
      std::__cxx11::string::append((char *)&itempl);
      std::__cxx11::string::append((string *)&itempl);
      bVar1 = cmsys::SystemTools::FileExists(&itempl);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&moduleInCMakeModulePath);
      }
      else if (debug) {
        _e = (pointer)debugBuffer->_M_string_length;
        mods._M_dataplus._M_p = (pointer)0x2;
        mods._M_string_length = (long)"Resource spec file:\n\n  " + 0x15;
        cmStrCat<std::__cxx11::string,char[2]>
                  (&local_1c8,(cmAlphaNum *)&e,(cmAlphaNum *)&mods,&itempl,(char (*) [2])0x64a205);
        std::__cxx11::string::operator=((string *)debugBuffer,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      std::__cxx11::string::~string((string *)&itempl);
      pbVar6 = pbVar6 + 1;
    } while (!bVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&modulePath);
  }
  psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  _e = (pointer)psVar4->_M_string_length;
  mods._M_dataplus._M_p = &DAT_00000009;
  mods._M_string_length = (size_type)anon_var_dwarf_66cdf9;
  cmStrCat<std::__cxx11::string>(&itempl,(cmAlphaNum *)&e,(cmAlphaNum *)&mods,filename);
  std::__cxx11::string::operator=((string *)&moduleInCMakeRoot,(string *)&itempl);
  std::__cxx11::string::~string((string *)&itempl);
  cmsys::SystemTools::ConvertToUnixSlashes(&moduleInCMakeRoot);
  bVar1 = cmsys::SystemTools::FileExists(&moduleInCMakeRoot);
  if (!bVar1) {
    if (debug) {
      _e = (pointer)debugBuffer->_M_string_length;
      mods._M_dataplus._M_p = (pointer)0x2;
      mods._M_string_length = (long)"Resource spec file:\n\n  " + 0x15;
      cmStrCat<std::__cxx11::string,char[2]>
                (&itempl,(cmAlphaNum *)&e,(cmAlphaNum *)&mods,&moduleInCMakeRoot,
                 (char (*) [2])0x64a205);
      std::__cxx11::string::operator=((string *)debugBuffer,(string *)&itempl);
      std::__cxx11::string::~string((string *)&itempl);
    }
    moduleInCMakeRoot._M_string_length = 0;
    *moduleInCMakeRoot._M_dataplus._M_p = '\0';
  }
  *system = false;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (__return_storage_ptr__->_M_string_length == 0) {
    *system = true;
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((moduleInCMakeModulePath._M_string_length == 0) || (moduleInCMakeRoot._M_string_length == 0))
  goto LAB_00251c5b;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&mods);
  cVar3 = GetDefinition(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&mods,psVar4,"/Modules/");
  if (cVar3.Value != (string *)0x0) {
    bVar1 = cmsys::SystemTools::IsSubDirectory(cVar3.Value,&mods);
    if (bVar1) {
      PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0017,false);
      if (PVar2 - NEW < 3) {
        bVar1 = true;
      }
      else {
        if (PVar2 != OLD) {
          if (PVar2 != WARN) goto LAB_00251c51;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,"File ");
          poVar5 = std::operator<<(poVar5,(string *)cVar3.Value);
          poVar5 = std::operator<<(poVar5," includes ");
          poVar5 = std::operator<<(poVar5,(string *)&moduleInCMakeModulePath);
          poVar5 = std::operator<<(poVar5," (found via CMAKE_MODULE_PATH) which shadows ");
          poVar5 = std::operator<<(poVar5,(string *)&moduleInCMakeRoot);
          poVar5 = std::operator<<(poVar5,". This may cause errors later on .\n");
          cmPolicies::GetPolicyWarning_abi_cxx11_(&itempl,(cmPolicies *)&DAT_00000011,id);
          std::operator<<(poVar5,(string *)&itempl);
          std::__cxx11::string::~string((string *)&itempl);
          std::__cxx11::stringbuf::str();
          IssueMessage(this,AUTHOR_WARNING,&itempl);
          std::__cxx11::string::~string((string *)&itempl);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        }
        bVar1 = false;
      }
      *system = bVar1;
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
LAB_00251c51:
  std::__cxx11::string::~string((string *)&mods);
LAB_00251c5b:
  std::__cxx11::string::~string((string *)&moduleInCMakeModulePath);
  std::__cxx11::string::~string((string *)&moduleInCMakeRoot);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetModulesFile(const std::string& filename,
                                       bool& system, bool debug,
                                       std::string& debugBuffer) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  cmValue cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath = cmExpandedList(*cmakeModulePath);

    // Look through the possible module directories.
    for (std::string itempl : modulePath) {
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl)) {
        moduleInCMakeModulePath = itempl;
        break;
      }
      if (debug) {
        debugBuffer = cmStrCat(debugBuffer, "  ", itempl, "\n");
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules/", filename);
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot)) {
    if (debug) {
      debugBuffer = cmStrCat(debugBuffer, "  ", moduleInCMakeRoot, "\n");
    }
    moduleInCMakeRoot.clear();
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  system = false;
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    system = true;
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    cmValue currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(*currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << *currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          system = false;
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          system = true;
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}